

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_apply_r(lyd_node **first_node,lyd_node *parent_node,lyd_node *diff_node,
                       lyd_diff_cb diff_cb,void *cb_data,ly_ht **dup_inst)

{
  undefined8 uVar1;
  LY_ERR LVar2;
  char *pcVar3;
  lyd_node *plVar4;
  lyd_node **first_node_00;
  undefined8 local_128;
  undefined8 local_110;
  ly_ctx *local_f8;
  LY_ERR ret___8;
  LY_ERR ret___7;
  lyd_node_any *any;
  char *__path_5;
  char *__path_4;
  LY_ERR ret___6;
  char *__path_3;
  LY_ERR ret___5;
  LY_ERR ret___4;
  char *__path_2;
  LY_ERR ret___3;
  char *__path_1;
  LY_ERR ret___2;
  char *__path;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_ctx *ctx;
  ly_ht *child_dup_inst;
  lyd_meta *meta;
  char *pcStack_68;
  lyd_diff_op op;
  char *meta_str;
  char *str_val;
  lyd_node *diff_child;
  lyd_node *match;
  ly_ht **pplStack_40;
  LY_ERR ret;
  ly_ht **dup_inst_local;
  void *cb_data_local;
  lyd_diff_cb diff_cb_local;
  lyd_node *diff_node_local;
  lyd_node *parent_node_local;
  lyd_node **first_node_local;
  
  ctx = (ly_ctx *)0x0;
  if (diff_node->schema == (lysc_node *)0x0) {
    local_f8 = (ly_ctx *)diff_node[2].schema;
  }
  else {
    local_f8 = diff_node->schema->module->ctx;
  }
  pplStack_40 = dup_inst;
  dup_inst_local = (ly_ht **)cb_data;
  cb_data_local = diff_cb;
  diff_cb_local = (lyd_diff_cb)diff_node;
  diff_node_local = parent_node;
  parent_node_local = (lyd_node *)first_node;
  LVar2 = lyd_diff_get_op(diff_node,(lyd_diff_op *)((long)&meta + 4));
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if ((((*(long *)(diff_cb_local + 8) == 0) || ((**(ushort **)(diff_cb_local + 8) & 0x18) == 0)) ||
      ((*(ushort *)(*(long *)(diff_cb_local + 8) + 2) & 0x40) == 0)) ||
     ((meta._4_4_ != 0 && (meta._4_4_ != 2)))) {
    switch(meta._4_4_) {
    case 0:
      LVar2 = lyd_dup_single((lyd_node *)diff_cb_local,(lyd_node_inner *)0x0,2,&diff_child);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      match._4_4_ = 0;
      if (diff_node_local == (lyd_node *)0x0) {
        match._4_4_ = lyd_insert_sibling(*(lyd_node **)parent_node_local,diff_child,
                                         (lyd_node **)parent_node_local);
      }
      else if ((diff_child->flags & 8) == 0) {
        match._4_4_ = lyd_insert_child(diff_node_local,diff_child);
      }
      else {
        match._4_4_ = lyplg_ext_insert(diff_node_local,diff_child);
      }
      if (match._4_4_ != LY_SUCCESS) {
        lyd_free_tree(diff_child);
        return match._4_4_;
      }
      break;
    case 1:
      LVar2 = lyd_diff_find_match(*(lyd_node **)parent_node_local,(lyd_node *)diff_cb_local,'\x01',
                                  pplStack_40,&diff_child);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (diff_child == (lyd_node *)0x0) {
        pcVar3 = lyd_path((lyd_node *)diff_cb_local,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_f8,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",pcVar3);
        free(pcVar3);
        return LY_EINVAL;
      }
      if ((diff_child == *(lyd_node **)parent_node_local) &&
         (diff_child->parent == (lyd_node_inner *)0x0)) {
        if (diff_node_local != (lyd_node *)0x0) {
          __assert_fail("!parent_node",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                        ,0x539,
                        "LY_ERR lyd_diff_apply_r(struct lyd_node **, struct lyd_node *, const struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **)"
                       );
        }
        uVar1 = *(undefined8 *)(*(long *)parent_node_local + 0x18);
        parent_node_local->hash = (int)uVar1;
        parent_node_local->flags = (int)((ulong)uVar1 >> 0x20);
      }
      lyd_free_tree(diff_child);
      return LY_SUCCESS;
    case 2:
      if ((**(ushort **)(diff_cb_local + 8) & 100) == 0) {
        pcVar3 = lys_nodetype2str(**(uint16_t **)(diff_cb_local + 8));
        if (*(long *)(diff_cb_local + 8) == 0) {
          local_128 = *(undefined8 *)(diff_cb_local + 0x40);
        }
        else {
          local_128 = *(undefined8 *)(*(long *)(diff_cb_local + 8) + 0x28);
        }
        ly_log(local_f8,LY_LLERR,LY_EINVAL,"Operation \"replace\" is invalid for %s node \"%s\".",
               pcVar3,local_128);
        return LY_EINVAL;
      }
      LVar2 = lyd_diff_find_match(*(lyd_node **)parent_node_local,(lyd_node *)diff_cb_local,'\x01',
                                  pplStack_40,&diff_child);
      plVar4 = diff_child;
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (diff_child == (lyd_node *)0x0) {
        pcVar3 = lyd_path((lyd_node *)diff_cb_local,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_f8,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",pcVar3);
        free(pcVar3);
        return LY_EINVAL;
      }
      if (**(short **)(diff_cb_local + 8) == 4) {
        pcVar3 = lyd_get_value((lyd_node *)diff_cb_local);
        match._4_4_ = lyd_change_term(plVar4,pcVar3);
        if ((match._4_4_ != LY_SUCCESS) && (match._4_4_ != LY_EEXIST)) {
          pcVar3 = lyd_path(diff_child,LYD_PATH_STD,(char *)0x0,0);
          ly_log(local_f8,LY_LLERR,LY_EINVAL,"Unexpected value of node \"%s\" in %s.",pcVar3,"data")
          ;
          free(pcVar3);
          return LY_EINVAL;
        }
      }
      else {
        LVar2 = lyd_any_copy_value(diff_child,(lyd_any_value *)(diff_cb_local + 0x38),
                                   *(LYD_ANYDATA_VALUETYPE *)(diff_cb_local + 0x40));
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      diff_child->flags = *(uint32_t *)(diff_cb_local + 4);
      break;
    case 3:
      LVar2 = lyd_diff_find_match(*(lyd_node **)parent_node_local,(lyd_node *)diff_cb_local,'\x01',
                                  pplStack_40,&diff_child);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (diff_child == (lyd_node *)0x0) {
        pcVar3 = lyd_path((lyd_node *)diff_cb_local,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_f8,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",pcVar3);
        free(pcVar3);
        return LY_EINVAL;
      }
      if ((diff_child->schema->nodetype & 0xc) == 0) {
        plVar4 = lyd_child_no_keys((lyd_node *)diff_cb_local);
        if (plVar4 == (lyd_node *)0x0) {
          if (*(long *)(diff_cb_local + 8) == 0) {
            local_110 = *(undefined8 *)(diff_cb_local + 0x40);
          }
          else {
            local_110 = *(undefined8 *)(*(long *)(diff_cb_local + 8) + 0x28);
          }
          ly_log(local_f8,LY_LLERR,LY_EINVAL,
                 "Operation \"none\" is invalid for node \"%s\" without children.",local_110);
          return LY_EINVAL;
        }
      }
      else if ((*(uint *)(diff_cb_local + 4) & 1) == 0) {
        diff_child->flags = diff_child->flags & 0xfffffffe;
      }
      else {
        diff_child->flags = diff_child->flags | 1;
      }
      break;
    default:
      ly_log(local_f8,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x55a);
      return LY_EINT;
    }
  }
  else {
    if (meta._4_4_ == 2) {
      LVar2 = lyd_diff_find_match(*(lyd_node **)parent_node_local,(lyd_node *)diff_cb_local,'\x01',
                                  pplStack_40,&diff_child);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (diff_child == (lyd_node *)0x0) {
        pcVar3 = lyd_path((lyd_node *)diff_cb_local,LYD_PATH_STD,(char *)0x0,0);
        ly_log(local_f8,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",pcVar3);
        free(pcVar3);
        return LY_EINVAL;
      }
    }
    else {
      LVar2 = lyd_dup_single((lyd_node *)diff_cb_local,(lyd_node_inner *)0x0,2,&diff_child);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    if ((*(long *)(diff_cb_local + 8) == 0) ||
       (((**(short **)(diff_cb_local + 8) != 0x10 ||
         ((*(ushort *)(*(long *)(diff_cb_local + 8) + 2) & 0x200) == 0)) &&
        ((**(short **)(diff_cb_local + 8) != 8 ||
         ((*(ushort *)(*(long *)(diff_cb_local + 8) + 2) & 1) != 0)))))) {
      if (**(short **)(diff_cb_local + 8) == 0x10) {
        pcStack_68 = "yang:key";
      }
      else {
        pcStack_68 = "yang:value";
      }
    }
    else {
      pcStack_68 = "yang:position";
    }
    child_dup_inst =
         (ly_ht *)lyd_find_meta(*(lyd_meta **)(diff_cb_local + 0x28),(lys_module *)0x0,pcStack_68);
    if ((lyd_meta *)child_dup_inst == (lyd_meta *)0x0) {
      pcVar3 = lyd_path((lyd_node *)diff_cb_local,LYD_PATH_STD,(char *)0x0,0);
      ly_log(local_f8,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
             pcStack_68,pcVar3);
      free(pcVar3);
      return LY_EINVAL;
    }
    meta_str = lyd_get_meta_value((lyd_meta *)child_dup_inst);
    if (*meta_str == '\0') {
      match._4_4_ = lyd_diff_insert((lyd_node **)parent_node_local,diff_node_local,diff_child,
                                    (char *)0x0);
    }
    else {
      match._4_4_ = lyd_diff_insert((lyd_node **)parent_node_local,diff_node_local,diff_child,
                                    meta_str);
    }
    if (match._4_4_ != LY_SUCCESS) {
      if (meta._4_4_ == 0) {
        lyd_free_tree(diff_child);
      }
      return match._4_4_;
    }
  }
  if ((cb_data_local == (void *)0x0) ||
     (first_node_local._4_4_ = (*(code *)cb_data_local)(diff_cb_local,diff_child,dup_inst_local),
     first_node_local._4_4_ == LY_SUCCESS)) {
    match._4_4_ = LY_SUCCESS;
    for (str_val = (char *)lyd_child_no_keys((lyd_node *)diff_cb_local); str_val != (char *)0x0;
        str_val = *(char **)(str_val + 0x18)) {
      first_node_00 = lyd_node_child_p(diff_child);
      match._4_4_ = lyd_diff_apply_r(first_node_00,diff_child,(lyd_node *)str_val,
                                     (lyd_diff_cb)cb_data_local,dup_inst_local,(ly_ht **)&ctx);
      if (match._4_4_ != LY_SUCCESS) break;
    }
    lyd_dup_inst_free((ly_ht *)ctx);
    first_node_local._4_4_ = match._4_4_;
  }
  return first_node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_apply_r(struct lyd_node **first_node, struct lyd_node *parent_node, const struct lyd_node *diff_node,
        lyd_diff_cb diff_cb, void *cb_data, struct ly_ht **dup_inst)
{
    LY_ERR ret;
    struct lyd_node *match, *diff_child;
    const char *str_val, *meta_str;
    enum lyd_diff_op op;
    struct lyd_meta *meta;
    struct ly_ht *child_dup_inst = NULL;
    const struct ly_ctx *ctx = LYD_CTX(diff_node);

    /* read all the valid attributes */
    LY_CHECK_RET(lyd_diff_get_op(diff_node, &op));

    /* handle specific user-ordered (leaf-)lists operations separately */
    if (lysc_is_userordered(diff_node->schema) && ((op == LYD_DIFF_OP_CREATE) || (op == LYD_DIFF_OP_REPLACE))) {
        if (op == LYD_DIFF_OP_REPLACE) {
            /* find the node (we must have some siblings because the node was only moved) */
            LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
            LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);
        } else {
            /* duplicate the node */
            LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));
        }

        /* get "key", "value", or "position" metadata string value */
        if (lysc_is_dup_inst_list(diff_node->schema)) {
            meta_str = "yang:position";
        } else if (diff_node->schema->nodetype == LYS_LIST) {
            meta_str = "yang:key";
        } else {
            meta_str = "yang:value";
        }
        meta = lyd_find_meta(diff_node->meta, NULL, meta_str);
        LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_str, diff_node), LY_EINVAL);
        str_val = lyd_get_meta_value(meta);

        /* insert/move the node */
        if (str_val[0]) {
            ret = lyd_diff_insert(first_node, parent_node, match, str_val);
        } else {
            ret = lyd_diff_insert(first_node, parent_node, match, NULL);
        }
        if (ret) {
            if (op == LYD_DIFF_OP_CREATE) {
                lyd_free_tree(match);
            }
            return ret;
        }

        goto next_iter_r;
    }

    /* apply operation */
    switch (op) {
    case LYD_DIFF_OP_NONE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        if (match->schema->nodetype & LYD_NODE_TERM) {
            /* special case of only dflt flag change */
            if (diff_node->flags & LYD_DEFAULT) {
                match->flags |= LYD_DEFAULT;
            } else {
                match->flags &= ~LYD_DEFAULT;
            }
        } else {
            /* none operation on nodes without children is redundant and hence forbidden */
            if (!lyd_child_no_keys(diff_node)) {
                LOGERR(ctx, LY_EINVAL, "Operation \"none\" is invalid for node \"%s\" without children.",
                        LYD_NAME(diff_node));
                return LY_EINVAL;
            }
        }
        break;
    case LYD_DIFF_OP_CREATE:
        /* duplicate the node */
        LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));

        /* insert it at the end */
        ret = 0;
        if (parent_node) {
            if (match->flags & LYD_EXT) {
                ret = lyplg_ext_insert(parent_node, match);
            } else {
                ret = lyd_insert_child(parent_node, match);
            }
        } else {
            ret = lyd_insert_sibling(*first_node, match, first_node);
        }
        if (ret) {
            lyd_free_tree(match);
            return ret;
        }

        break;
    case LYD_DIFF_OP_DELETE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* remove it */
        if ((match == *first_node) && !match->parent) {
            assert(!parent_node);
            /* we have removed the top-level node */
            *first_node = (*first_node)->next;
        }
        lyd_free_tree(match);

        /* we are not going recursively in this case, the whole subtree was already deleted */
        return LY_SUCCESS;
    case LYD_DIFF_OP_REPLACE:
        if (!(diff_node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA))) {
            LOGERR(ctx, LY_EINVAL, "Operation \"replace\" is invalid for %s node \"%s\".",
                    lys_nodetype2str(diff_node->schema->nodetype), LYD_NAME(diff_node));
            return LY_EINVAL;
        }

        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* update the value */
        if (diff_node->schema->nodetype == LYS_LEAF) {
            ret = lyd_change_term(match, lyd_get_value(diff_node));
            LY_CHECK_ERR_RET(ret && (ret != LY_EEXIST), LOGERR_UNEXPVAL(ctx, match, "data"), LY_EINVAL);
        } else {
            struct lyd_node_any *any = (struct lyd_node_any *)diff_node;

            LY_CHECK_RET(lyd_any_copy_value(match, &any->value, any->value_type));
        }

        /* with flags */
        match->flags = diff_node->flags;
        break;
    default:
        LOGINT_RET(ctx);
    }

next_iter_r:
    if (diff_cb) {
        /* call callback */
        LY_CHECK_RET(diff_cb(diff_node, match, cb_data));
    }

    /* apply diff recursively */
    ret = LY_SUCCESS;
    LY_LIST_FOR(lyd_child_no_keys(diff_node), diff_child) {
        ret = lyd_diff_apply_r(lyd_node_child_p(match), match, diff_child, diff_cb, cb_data, &child_dup_inst);
        if (ret) {
            break;
        }
    }

    lyd_dup_inst_free(child_dup_inst);
    return ret;
}